

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shifts.c
# Opt level: O1

uint32_t arm_shift(status_register_t *cpsr,shift_type_t type,uint32_t data,uint32_t shift_amount)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t extraout_EAX;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  uint extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  undefined4 in_register_00000034;
  uint *puVar4;
  uint *puVar5;
  ulong uVar6;
  arm7tdmi_t *state;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar7;
  undefined8 uVar8;
  
  puVar4 = (uint *)CONCAT44(in_register_00000034,type);
  switch(type) {
  case LSL:
    uVar2 = arm_lsl(cpsr,data,shift_amount);
    return uVar2;
  case LSR:
    uVar2 = arm_lsr(cpsr,data,shift_amount);
    return uVar2;
  case ASR:
    uVar2 = arm_asr(cpsr,data,shift_amount);
    return uVar2;
  case ROR:
    if ((shift_amount != 0) &&
       (bVar1 = (byte)shift_amount & 0x1f, data = data >> bVar1 | data << 0x20 - bVar1,
       cpsr != (status_register_t *)0x0)) {
      cpsr->raw = cpsr->raw & 0xdfffffff | data >> 2 & 0x20000000;
    }
    return data;
  default:
    uVar6 = (ulong)type;
    arm_shift_cold_1();
    puVar5 = puVar4;
    if (2 < gba_log_verbosity) {
      puts("[DEBUG] ----handling special case, immediate shift amount 0----");
    }
  }
  switch(extraout_EDX) {
  case 0:
    return shift_amount;
  case 1:
    if (2 < gba_log_verbosity) {
      puts("[DEBUG] LSR shift");
    }
    uVar2 = 0;
    break;
  case 2:
    uVar2 = (int)shift_amount >> 0x1f;
    break;
  case 3:
    uVar3 = *(uint *)(uVar6 + 0xb4);
    if (puVar4 != (uint *)0x0) {
      *puVar4 = *puVar4 & 0xdfffffff | (shift_amount & 1) << 0x1d;
    }
    return (shift_amount >> 1) + (uVar3 & 0xe0000000) * 4;
  default:
    state = (arm7tdmi_t *)(ulong)extraout_EDX;
    arm_shift_special_zero_behavior_cold_1();
    if ((int)puVar5 <= extraout_EDX_00) {
      uVar3 = 1 << ((char)puVar5 - 1U & 0x1f) & (uint)state;
      return ((uint)state ^ uVar3) - uVar3;
    }
    uVar8 = extraout_RAX;
    sign_extend_64_cold_1();
    if ((int)puVar5 <= extraout_EDX_01) {
      uVar3 = 1 << ((char)puVar5 - 1U & 0x1f) & (uint)state;
      return ((uint)state ^ uVar3) - uVar3;
    }
    uVar7 = extraout_RAX_00;
    sign_extend_word_cold_1();
    if (gba_log_verbosity != 0) {
      printf("\x1b[0;33m[WARN]  adjusted pc: 0x%08X: SWI: 0x%X - %s\n\x1b[0;m",
             (ulong)((state->pc + (((state->cpsr).raw & 0x20) >> 3)) - 8),(ulong)puVar5 & 0xff,
             SWI_NAMES_rel + *(int *)(SWI_NAMES_rel + ((ulong)puVar5 & 0xff) * 4),in_R8,in_R9,
             (ulong)shift_amount,uVar7,uVar8);
    }
    uVar3 = (state->cpsr).raw;
    (state->cpsr).raw = uVar3 & 0xffffffe0 | 0x13;
    set_spsr(state,uVar3);
    state->lr_svc = (state->pc + (((state->cpsr).raw & 0x20) >> 4)) - 4;
    (state->cpsr).raw = (state->cpsr).raw & 0xffffff5f | 0x80;
    set_pc(state,8);
    return extraout_EAX;
  }
  if (puVar4 != (uint *)0x0) {
    *puVar4 = *puVar4 & 0xdfffffff | shift_amount >> 2 & 0x20000000;
  }
  return uVar2;
}

Assistant:

word arm_shift(status_register_t* cpsr, shift_type_t type, word data, word shift_amount) {
    switch (type) {
        case LSL:
            return arm_lsl(cpsr, data, shift_amount);
        case LSR:
            return arm_lsr(cpsr, data, shift_amount);
        case ASR:
            return arm_asr(cpsr, data, shift_amount);
        case ROR:
            return arm_ror(cpsr, data, shift_amount);
        default:
            logfatal("Unknown shift type: %d", type)
    }
}